

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O1

void ZCCParse(void *yyp,int yymajor,ZCCToken yyminor,ZCCParseState *stat)

{
  ushort uVar1;
  short sVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  ushort *puVar6;
  FString *pFVar7;
  ulong uVar8;
  uint uVar9;
  undefined8 uVar10;
  ulong uVar11;
  char *tail;
  long lVar12;
  int j;
  uint uVar13;
  ulong uVar14;
  byte *pbVar15;
  ZCCToken yyMinor;
  ZCCToken yyMinor_00;
  FString expecting;
  FString unexpected;
  FString local_70;
  int local_68;
  int local_64;
  long local_60;
  FString local_58;
  FString local_50;
  anon_union_8_3_77c0fe9c_for_ZCCToken_0 local_48;
  char *local_40;
  long local_38;
  
  local_48 = yyminor.field_0;
  local_64 = yyminor.SourceLoc;
  if (*yyp < 0) {
    *(undefined8 *)yyp = 0xffffffff00000000;
    *(undefined2 *)((long)yyp + 0x10) = 0;
    *(undefined1 *)((long)yyp + 0x12) = 0;
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sInitialize. Empty stack. State 0\n",yyTracePrompt);
    }
  }
  *(ZCCParseState **)((long)yyp + 8) = stat;
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sInput \'%s\'\n",yyTracePrompt,yyTokenName[yymajor]);
  }
  local_60 = (long)yyp + 0x10;
  local_40 = FString::NullString.Nothing;
  local_68 = 0;
  do {
    uVar1 = *(ushort *)(local_60 + (long)*yyp * 0x30);
    uVar14 = (ulong)uVar1;
    if (uVar14 < 0x2cd) {
      if (0xf4 < uVar1) {
        __assert_fail("stateno <= YY_SHIFT_COUNT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O1/src/zcc-parse.c"
                      ,0x65f,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
      }
      sVar2 = yy_shift_ofst[uVar14];
      uVar5 = (ulong)(uint)yymajor;
      if (sVar2 != -0x31) {
        do {
          bVar4 = (byte)uVar5;
          if (bVar4 == 0xda) {
            __assert_fail("iLookAhead!=YYNOCODE",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O1/src/zcc-parse.c"
                          ,0x663,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
          }
          uVar8 = uVar5 & 0xff;
          uVar9 = (int)uVar8 + (int)sVar2;
          if ((uVar9 < 0x880) && (yy_lookahead[uVar9] == bVar4)) {
            puVar6 = yy_action + uVar9;
            goto LAB_006a25db;
          }
          if (bVar4 == 0) break;
          bVar3 = true;
          if ((bVar4 < 0x5e) && (uVar11 = (ulong)""[uVar8], uVar11 != 0)) {
            if (yyTraceFILE != (FILE *)0x0) {
              fprintf((FILE *)yyTraceFILE,"%sFALLBACK %s => %s\n",yyTracePrompt,yyTokenName[uVar8],
                      yyTokenName[uVar11]);
            }
            if (""[uVar11] != '\0') {
              __assert_fail("yyFallback[iFallback]==0",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O1/src/zcc-parse.c"
                            ,0x671,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
            }
            bVar3 = false;
            uVar5 = uVar11;
          }
        } while (!bVar3);
      }
      puVar6 = yy_default + uVar14;
LAB_006a25db:
      uVar1 = *puVar6;
    }
    uVar9 = (uint)uVar1;
    if (uVar9 < 0x2cd) {
      uVar13 = uVar9 + 0x113;
      if (uVar9 < 0xf5) {
        uVar13 = uVar9;
      }
      yyMinor.SourceLoc = local_64;
      yyMinor.field_0.String = local_48.String;
      yyMinor._12_4_ = 0;
      yy_shift((yyParser_conflict *)yyp,uVar13,yymajor,yyMinor);
      *(int *)((long)yyp + 4) = *(int *)((long)yyp + 4) + -1;
      yymajor = 0xda;
    }
    else if (uVar9 < 0x3e0) {
      yy_reduce((yyParser_conflict *)yyp,uVar9 - 0x2cd);
    }
    else {
      if (uVar9 != 0x3e0) {
        __assert_fail("yyact == YY_ERROR_ACTION",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O1/src/zcc-parse.c"
                      ,0x1165,"void ZCCParse(void *, int, ZCCToken, ZCCParseState *)");
      }
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
      }
      if (*(int *)((long)yyp + 4) < 0) {
        lVar12 = *(long *)((long)yyp + 8);
        local_58.Chars = local_40;
        local_70.Chars = local_40;
        FString::NullString.RefCount = FString::NullString.RefCount + 2;
        uVar1 = *(ushort *)(local_60 + (long)*yyp * 0x30);
        pFVar7 = FString::operator+=(&local_58,"Unexpected ");
        ZCCTokenName((int)&local_50);
        local_38 = lVar12;
        FString::operator+=(pFVar7,&local_50);
        FString::~FString(&local_50);
        if ((uVar1 < 0x6d8) && (sVar2 = yy_shift_ofst[uVar1], (long)sVar2 != -0x31)) {
          uVar14 = 1;
          do {
            uVar5 = uVar14 + (long)sVar2;
            if ((uVar5 < 0x880) && (uVar14 == yy_lookahead[uVar5])) {
              tail = "Expecting ";
              if (((FNullStringData *)(local_70.Chars + -0xc))->Len != 0) {
                tail = " or ";
              }
              pFVar7 = FString::operator+=(&local_70,tail);
              ZCCTokenName((int)&local_50);
              FString::operator+=(pFVar7,&local_50);
              FString::~FString(&local_50);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0x80);
        }
        lVar12 = local_38;
        FScanner::ScriptMessage(*(FScanner **)(local_38 + 0x828),"%s\n%s\n",local_58.Chars);
        *(long *)((long)yyp + 8) = lVar12;
        FString::~FString(&local_70);
        FString::~FString(&local_58);
      }
      if (local_68 == 0) {
        uVar9 = *yyp;
        if ((int)uVar9 < 0) {
          uVar13 = 0x3e0;
          bVar3 = true;
        }
        else {
          do {
            uVar1 = yy_default[*(ushort *)(local_60 + (ulong)uVar9 * 0x30)];
            uVar13 = (uint)uVar1;
            bVar3 = uVar1 >= 0x2cd;
            if (uVar1 < 0x2cd) break;
            yy_pop_parser_stack((yyParser_conflict *)yyp);
            uVar9 = *yyp;
          } while (-1 < (int)uVar9);
        }
        if ((yymajor == 0) || (bVar3)) {
          uVar10 = *(undefined8 *)((long)yyp + 8);
          if (yyTraceFILE != (FILE *)0x0) {
            fprintf((FILE *)yyTraceFILE,"%sFail!\n",yyTracePrompt);
          }
          while (-1 < *yyp) {
            yy_pop_parser_stack((yyParser_conflict *)yyp);
          }
          *(undefined8 *)((long)yyp + 8) = uVar10;
          uVar9 = 0xda;
        }
        else {
          yyMinor_00.SourceLoc = local_64;
          yyMinor_00.field_0.Float = local_48.Float;
          yyMinor_00._12_4_ = 0;
          yy_shift((yyParser_conflict *)yyp,uVar13,0x80,yyMinor_00);
          uVar9 = yymajor;
        }
      }
      else {
        uVar9 = 0xda;
        if (yyTraceFILE != (FILE *)0x0) {
          fprintf((FILE *)yyTraceFILE,"%sDiscard input token %s\n",yyTracePrompt,
                  yyTokenName[yymajor]);
        }
      }
      yymajor = uVar9;
      *(undefined4 *)((long)yyp + 4) = 3;
      local_68 = 1;
    }
    if ((yymajor == 0xda) || (*yyp < 0)) {
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
        if (0 < *yyp) {
          pbVar15 = (byte *)((long)yyp + 0x42);
          lVar12 = 0;
          do {
            uVar10 = 0x20;
            if (lVar12 == 0) {
              uVar10 = 0x5b;
            }
            fprintf((FILE *)yyTraceFILE,"%c%s",uVar10,yyTokenName[*pbVar15]);
            lVar12 = lVar12 + 1;
            pbVar15 = pbVar15 + 0x30;
          } while (lVar12 < *yyp);
        }
        fwrite("]\n",2,1,(FILE *)yyTraceFILE);
      }
      return;
    }
  } while( true );
}

Assistant:

void ZCCParse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  ZCCParseTOKENTYPE yyminor       /* The value for the token */
  ZCCParseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  unsigned int yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser;  /* The parser */

  /* (re)initialize the parser, if necessary */
  yypParser = (yyParser*)yyp;
  if( yypParser->yyidx<0 ){
#if YYSTACKDEPTH<=0
    if( yypParser->yystksz <=0 ){
      yyStackOverflow(yypParser);
      return;
    }
#endif
    yypParser->yyidx = 0;
#ifndef YYNOERRORRECOVERY
    yypParser->yyerrcnt = -1;
#endif
    yypParser->yystack[0].stateno = 0;
    yypParser->yystack[0].major = 0;
#ifndef NDEBUG
    if( yyTraceFILE ){
      fprintf(yyTraceFILE,"%sInitialize. Empty stack. State 0\n",
              yyTracePrompt);
    }
#endif
  }
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif
  ZCCParseARG_STORE;

#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sInput '%s'\n",yyTracePrompt,yyTokenName[yymajor]);
  }
#endif

  do{
    yyact = yy_find_shift_action(yypParser,(YYCODETYPE)yymajor);
    if( yyact <= YY_MAX_SHIFTREDUCE ){
      if( yyact > YY_MAX_SHIFT ) yyact += YY_MIN_REDUCE - YY_MIN_SHIFTREDUCE;
      yy_shift(yypParser,yyact,yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      yymajor = YYNOCODE;
    }else if( yyact <= YY_MAX_REDUCE ){
      yy_reduce(yypParser,yyact-YY_MIN_REDUCE);
    }else{
#ifdef YYERRORSYMBOL
      int yymx;
#endif
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yystack[yypParser->yyidx].major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while(
          yypParser->yyidx >= 0 &&
          yymx != YYERRORSYMBOL &&
          (yyact = yy_find_reduce_action(
                        yypParser->yystack[yypParser->yyidx].stateno,
                        YYERRORSYMBOL)) >= YY_MIN_REDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yyidx < 0 || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      yymajor = YYNOCODE;

#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
      }
      yymajor = YYNOCODE;
#endif
    }
  }while( yymajor!=YYNOCODE && yypParser->yyidx>=0 );
#ifndef NDEBUG
  if( yyTraceFILE ){
    int i;
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=1; i<=yypParser->yyidx; i++)
      fprintf(yyTraceFILE,"%c%s", i==1 ? '[' : ' ', 
              yyTokenName[yypParser->yystack[i].major]);
    fprintf(yyTraceFILE,"]\n");
  }
#endif
  return;
}